

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometrycollection.cpp
# Opt level: O2

Primitive * newPrimitive(Json *conf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  vec2f vVar4;
  vec3f vn2;
  vec3f vn3;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  bool bVar10;
  const_reference pvVar11;
  mapped_type *ppPVar12;
  Triangle *this;
  runtime_error *this_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  float fVar13;
  vec3f vVar14;
  vec3f vVar15;
  vec3f vVar16;
  vec3f v1;
  float local_14c;
  undefined8 local_138;
  float local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  vec2f local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  float local_68;
  float fStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  pvVar11 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar9 = nlohmann::operator==<const_char_*,_0>(pvVar11,"mesh");
  if (bVar9) {
    pvVar11 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"file");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_e0,pvVar11);
    ppPVar12 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(anonymous_namespace)::meshref_abi_cxx11_,&local_e0);
    this = (Triangle *)*ppPVar12;
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    this = (Triangle *)0x0;
  }
  pvVar11 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar9 = nlohmann::operator==<const_char_*,_0>(pvVar11,"sphere");
  if (bVar9) {
    this = (Triangle *)operator_new(0x18);
    pvVar11 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"origin");
    vVar14 = json2vec3f(pvVar11);
    pvVar11 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"radius");
    dVar3 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<double,_double,_0>(pvVar11);
    (((ParamSurface *)&this->super_BasicPrimitive)->super_Primitive)._vptr_Primitive =
         (_func_int **)&PTR_intersect_001602f0;
    *(BasicContainer **)&this->v1 = vVar14._0_8_;
    (this->v1).z = vVar14.z;
    (this->v2).x = (float)dVar3;
  }
  pvVar11 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar9 = nlohmann::operator==<const_char_*,_0>(pvVar11,"plane");
  if (bVar9) {
    this = (Triangle *)operator_new(0x18);
    pvVar11 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"normal");
    vVar14 = json2vec3f(pvVar11);
    pvVar11 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"offset");
    dVar3 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<double,_double,_0>(pvVar11);
    (((ParamSurface *)&this->super_BasicPrimitive)->super_Primitive)._vptr_Primitive =
         (_func_int **)&PTR_intersect_00160350;
    *(BasicContainer **)&this->v1 = vVar14._0_8_;
    (this->v1).z = vVar14.z;
    (this->v2).x = (float)dVar3;
  }
  pvVar11 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar9 = nlohmann::operator==<const_char_*,_0>(pvVar11,"cube");
  if (bVar9) {
    this = (Triangle *)operator_new(8);
    (((ParamSurface *)&this->super_BasicPrimitive)->super_Primitive)._vptr_Primitive =
         (_func_int **)&PTR_intersect_001603b0;
  }
  pvVar11 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar9 = nlohmann::operator==<const_char_*,_0>(pvVar11,"quad");
  if (bVar9) {
    this = (Triangle *)operator_new(8);
    (((ParamSurface *)&this->super_BasicPrimitive)->super_Primitive)._vptr_Primitive =
         (_func_int **)&PTR_intersect_001603f0;
  }
  pvVar11 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar9 = nlohmann::operator==<const_char_*,_0>(pvVar11,"revsurface");
  if (bVar9) {
    this = (Triangle *)operator_new(0x18);
    RevSurface::RevSurface((RevSurface *)this,conf);
  }
  pvVar11 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar9 = nlohmann::operator==<const_char_*,_0>(pvVar11,"triangle");
  if (bVar9) {
    pvVar11 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"vertices");
    pvVar11 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](pvVar11,0);
    vVar14 = json2vec3f(pvVar11);
    v1.z = vVar14.z;
    local_38._8_4_ = extraout_XMM0_Dc;
    local_38._0_8_ = vVar14._0_8_;
    local_38._12_4_ = extraout_XMM0_Dd;
    pvVar11 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"vertices");
    pvVar11 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](pvVar11,1);
    vVar14 = json2vec3f(pvVar11);
    local_48._8_4_ = extraout_XMM0_Dc_00;
    local_48._0_8_ = vVar14._0_8_;
    local_48._12_4_ = extraout_XMM0_Dd_00;
    pvVar11 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"vertices");
    pvVar11 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](pvVar11,2);
    vVar15 = json2vec3f(pvVar11);
    local_58._8_4_ = extraout_XMM0_Dc_01;
    local_58._0_8_ = vVar15._0_8_;
    local_58._12_4_ = extraout_XMM0_Dd_01;
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[8]>
              ((const_iterator *)&local_e0,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)conf,(char (*) [8])0x146aed);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::cend((const_iterator *)&local_88,conf);
    bVar9 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&local_e0,
                         (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&local_88);
    local_128 = 0.0;
    local_138 = 0;
    local_14c = 0.0;
    local_68 = 0.0;
    fStack_64 = 0.0;
    uStack_60 = 0;
    uStack_5c = 0;
    local_98 = ZEXT816(0);
    fVar13 = 0.0;
    if (bVar9) {
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)conf,"normals");
      pvVar11 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[](pvVar11,0);
      vVar16 = json2vec3f(pvVar11);
      local_128 = vVar16.z;
      local_138 = vVar16._0_8_;
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)conf,"normals");
      pvVar11 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[](pvVar11,1);
      vVar16 = json2vec3f(pvVar11);
      local_14c = vVar16.z;
      local_98._8_4_ = extraout_XMM0_Dc_02;
      local_98._0_8_ = vVar16._0_8_;
      local_98._12_4_ = extraout_XMM0_Dd_02;
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)conf,"normals");
      pvVar11 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[](pvVar11,2);
      vVar16 = json2vec3f(pvVar11);
      fVar13 = vVar16.z;
      local_68 = vVar16.x;
      fStack_64 = vVar16.y;
      uStack_60 = extraout_XMM0_Dc_03;
      uStack_5c = extraout_XMM0_Dd_03;
    }
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[4]>
              ((const_iterator *)&local_e0,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)conf,(char (*) [4])"uvs");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::cend((const_iterator *)&local_88,conf);
    bVar10 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)&local_e0,
                          (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)&local_88);
    if (bVar10) {
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)conf,"uvs");
      pvVar11 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[](pvVar11,0);
      vVar4 = json2vec2f(pvVar11);
      local_a8._8_4_ = extraout_XMM0_Dc_04;
      local_a8._0_4_ = vVar4.x;
      local_a8._4_4_ = vVar4.y;
      local_a8._12_4_ = extraout_XMM0_Dd_04;
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)conf,"uvs");
      pvVar11 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[](pvVar11,1);
      vVar4 = json2vec2f(pvVar11);
      local_b8._8_4_ = extraout_XMM0_Dc_05;
      local_b8._0_4_ = vVar4.x;
      local_b8._4_4_ = vVar4.y;
      local_b8._12_4_ = extraout_XMM0_Dd_05;
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)conf,"uvs");
      pvVar11 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[](pvVar11,2);
      local_c0 = json2vec2f(pvVar11);
    }
    else {
      local_c0.x = 0.0;
      local_c0.y = 0.0;
      local_b8 = ZEXT816(0);
      local_a8 = ZEXT816(0);
    }
    this = (Triangle *)operator_new(0xa0);
    auVar8 = local_38;
    auVar7 = local_48;
    auVar6 = local_58;
    auVar5 = local_98;
    vn3.y = fStack_64;
    vn3.x = local_68;
    vVar16.z = local_128;
    vVar16.x = (float)(undefined4)local_138;
    vVar16.y = (float)local_138._4_4_;
    vn2.z = local_14c;
    vn2.x = (float)local_98._0_4_;
    vn2.y = (float)local_98._4_4_;
    vn3.z = fVar13;
    v1.x = (float)local_38._0_4_;
    v1.y = (float)local_38._4_4_;
    vVar14.z = vVar14.z;
    vVar14.x = (float)local_48._0_4_;
    vVar14.y = (float)local_48._4_4_;
    vVar15.z = vVar15.z;
    vVar15.x = (float)local_58._0_4_;
    vVar15.y = (float)local_58._4_4_;
    local_98 = auVar5;
    local_58 = auVar6;
    local_48 = auVar7;
    local_38 = auVar8;
    Triangle::Triangle(this,v1,vVar14,vVar15,(vec2f)local_a8._0_8_,(vec2f)local_b8._0_8_,local_c0,
                       vVar16,vn2,vn3);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[18]>
              ((const_iterator *)&local_e0,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)conf,(char (*) [18])"recompute_normals");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::cend((const_iterator *)&local_88,conf);
    bVar10 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)&local_e0,
                          (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)&local_88);
    if (bVar10) {
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)conf,"recompute_normals");
      bVar9 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::get<bool,_bool,_0>(pvVar11);
      if (!bVar9) {
        return (Primitive *)this;
      }
    }
    else if (bVar9) {
      return (Primitive *)this;
    }
    fVar13 = (this->planeNormal).z;
    (this->vn3).z = fVar13;
    uVar1 = (this->planeNormal).x;
    uVar2 = (this->planeNormal).y;
    (this->vn3).x = (float)uVar1;
    (this->vn3).y = (float)uVar2;
    (this->vn2).x = (float)uVar1;
    (this->vn2).y = (float)uVar2;
    (this->vn2).z = fVar13;
    (this->vn1).x = (float)uVar1;
    (this->vn1).y = (float)uVar2;
    (this->vn1).z = fVar13;
  }
  else if (this == (Triangle *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    pvVar11 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"type");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_88,pvVar11);
    std::operator+(&local_e0,"Unrecognized Geometric type: ",&local_88);
    std::runtime_error::runtime_error(this_00,(string *)&local_e0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (Primitive *)this;
}

Assistant:

Primitive* newPrimitive(const Json& conf)
{
	Primitive* shape = NULL;
	if (conf["type"] == "mesh") {
		shape = meshref[conf["file"]];
	}
	if (conf["type"] == "sphere") {
		shape = new Sphere(json2vec3f(conf["origin"]), (double)conf["radius"]);
	}
	if (conf["type"] == "plane") {
		shape = new Plane(json2vec3f(conf["normal"]), (double)conf["offset"]);
	}
	if (conf["type"] == "cube") {
		shape = new Cube();
	}
	if (conf["type"] == "quad") {
		shape = new Quad();
	}
	if (conf["type"] == "revsurface") {
		shape = new RevSurface(conf);
	}
	if (conf["type"] == "triangle") {
		vec3f v1,v2,v3,n1,n2,n3;
		bool recompute_normal = true;
		v1 = json2vec3f(conf["vertices"][0]);
		v2 = json2vec3f(conf["vertices"][1]);
		v3 = json2vec3f(conf["vertices"][2]);
		if (conf.find("normals") != conf.end()) {
			recompute_normal = false;
			n1 = json2vec3f(conf["normals"][0]);
			n2 = json2vec3f(conf["normals"][1]);
			n3 = json2vec3f(conf["normals"][2]);
		}
		vec2f t1,t2,t3;
		if (conf.find("uvs") != conf.end()) {
			t1 = json2vec2f(conf["uvs"][0]);
			t2 = json2vec2f(conf["uvs"][1]);
			t3 = json2vec2f(conf["uvs"][2]);
		}
		Triangle* tshape = new Triangle(v1,v2,v3,t1,t2,t3,n1,n2,n3);
		if (conf.find("recompute_normals") != conf.end())
			recompute_normal = conf["recompute_normals"];
		if (recompute_normal)
			tshape->recompute_normal();
		shape = tshape;
	}
	if (shape == NULL) {
		throw std::runtime_error("Unrecognized Geometric type: " + std::string(conf["type"]));
	}
	return shape;
}